

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O2

void Saig_ManCbaShrink(Saig_ManCba_t *p)

{
  ulong uVar1;
  int iVar2;
  int Lit;
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj_00;
  Vec_Int_t *pVVar6;
  Aig_Man_t *pAVar7;
  int i;
  Vec_Vec_t *pVVar8;
  int iVar9;
  double dVar10;
  
  i = 0;
  do {
    pVVar8 = p->vReg2Frame;
    iVar9 = pVVar8->nSize;
    if (iVar9 <= i) {
      for (uVar4 = 0; (int)uVar4 < iVar9; uVar4 = uVar4 + 1) {
        pVVar5 = Vec_VecEntryInt(pVVar8,uVar4);
        pVVar6 = Vec_VecEntryInt(p->vReg2Value,uVar4);
        uVar1 = (long)pVVar5->nSize / 2;
        dVar10 = (double)p->pAig->nRegs;
        printf("Level = %4d   StateBits = %4d (%6.2f %%)  CareBits = %4d (%6.2f %%)\n",
               ((double)(int)uVar1 * 100.0) / dVar10,((double)pVVar6->nSize * 100.0) / dVar10,
               (ulong)uVar4,uVar1 & 0xffffffff);
        pVVar8 = p->vReg2Frame;
        iVar9 = pVVar8->nSize;
      }
      pAVar7 = Saig_ManDupWithCubes(p->pAig,p->vReg2Value);
      Aig_ManStop(pAVar7);
      return;
    }
    pVVar5 = Vec_VecEntryInt(pVVar8,i);
    for (iVar9 = 1; iVar9 < pVVar5->nSize; iVar9 = iVar9 + 2) {
      iVar2 = Vec_IntEntry(pVVar5,iVar9 + -1);
      Lit = Vec_IntEntry(pVVar5,iVar9);
      pAVar7 = p->pFrames;
      iVar3 = Abc_Lit2Var(Lit);
      pObj = Aig_ManObj(pAVar7,iVar3);
      if (pObj != (Aig_Obj_t *)0x0) {
        iVar3 = Aig_ObjIsConst1(pObj);
        if ((iVar3 != 0) || (pObj->TravId == p->pFrames->nTravIds)) {
          pObj_00 = Aig_ManObj(p->pAig,iVar2);
          iVar2 = Saig_ObjIsLi(p->pAig,pObj_00);
          if (iVar2 == 0) {
            __assert_fail("Saig_ObjIsLi(p->pAig, pObjLi)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldCex.c"
                          ,0x23a,"void Saig_ManCbaShrink(Saig_ManCba_t *)");
          }
          pVVar8 = p->vReg2Value;
          iVar3 = Aig_ObjCioId(pObj_00);
          iVar2 = p->pAig->nTruePos;
          uVar4 = Abc_LitIsCompl(Lit);
          iVar2 = Abc_Var2Lit(iVar3 - iVar2,(pObj->field_0x18 & 8) == 0 ^ uVar4);
          Vec_VecPushInt(pVVar8,i,iVar2);
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Saig_ManCbaShrink( Saig_ManCba_t * p )
{
    Aig_Man_t * pManNew;
    Aig_Obj_t * pObjLi, * pObjFrame;
    Vec_Int_t * vLevel, * vLevel2;
    int f, k, ObjId, Lit;
    // assuming that important objects are labeled in Saig_ManCbaFindReason()
    Vec_VecForEachLevelInt( p->vReg2Frame, vLevel, f )
    {
        Vec_IntForEachEntryDouble( vLevel, ObjId, Lit, k )
        {
            pObjFrame = Aig_ManObj( p->pFrames, Abc_Lit2Var(Lit) );
            if ( pObjFrame == NULL || (!Aig_ObjIsConst1(pObjFrame) && !Aig_ObjIsTravIdCurrent(p->pFrames, pObjFrame)) )
                continue;
            pObjLi = Aig_ManObj( p->pAig, ObjId );
            assert( Saig_ObjIsLi(p->pAig, pObjLi) );
            Vec_VecPushInt( p->vReg2Value, f, Abc_Var2Lit( Aig_ObjCioId(pObjLi) - Saig_ManPoNum(p->pAig), Abc_LitIsCompl(Lit) ^ !pObjFrame->fPhase ) );
        }
    }
    // print statistics
    Vec_VecForEachLevelInt( p->vReg2Frame, vLevel, k )
    {
        vLevel2 = Vec_VecEntryInt( p->vReg2Value, k );
        printf( "Level = %4d   StateBits = %4d (%6.2f %%)  CareBits = %4d (%6.2f %%)\n", k, 
            Vec_IntSize(vLevel)/2, 100.0 * (Vec_IntSize(vLevel)/2) / Aig_ManRegNum(p->pAig),
            Vec_IntSize(vLevel2),  100.0 * Vec_IntSize(vLevel2) / Aig_ManRegNum(p->pAig) );
    }
    // try reducing the frames
    pManNew = Saig_ManDupWithCubes( p->pAig, p->vReg2Value );
//    Ioa_WriteAiger( pManNew, "aigcube.aig", 0, 0 );
    Aig_ManStop( pManNew );
}